

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshTopology::TopEdgeIsHidden(ON_MeshTopology *this,int topei)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ON_MeshTopologyVertex *pOVar4;
  ON_MeshTopologyEdge *pOVar5;
  bool *pbVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (this->m_mesh == (ON_Mesh *)0x0) {
    bVar9 = false;
  }
  else {
    pbVar6 = ON_Mesh::HiddenVertexArray(this->m_mesh);
    bVar9 = false;
    if (((-1 < topei) && (bVar9 = false, pbVar6 != (bool *)0x0)) && (topei < (this->m_tope).m_count)
       ) {
      pOVar4 = (this->m_topv).m_a;
      pOVar5 = (this->m_tope).m_a;
      iVar2 = pOVar5[(uint)topei].m_topvi[0];
      iVar3 = pOVar5[(uint)topei].m_topvi[1];
      uVar8 = 0;
      uVar7 = (ulong)(uint)pOVar4[iVar2].m_v_count;
      if (pOVar4[iVar2].m_v_count < 1) {
        uVar7 = uVar8;
      }
      do {
        if (uVar7 == uVar8) {
          return true;
        }
        piVar1 = pOVar4[iVar2].m_vi + uVar8;
        uVar8 = uVar8 + 1;
      } while (pbVar6[*piVar1] != false);
      uVar8 = 0;
      uVar7 = (ulong)(uint)pOVar4[iVar3].m_v_count;
      if (pOVar4[iVar3].m_v_count < 1) {
        uVar7 = uVar8;
      }
      do {
        bVar9 = uVar7 == uVar8;
        if (bVar9) {
          return bVar9;
        }
        piVar1 = pOVar4[iVar3].m_vi + uVar8;
        uVar8 = uVar8 + 1;
      } while (pbVar6[*piVar1] != false);
    }
  }
  return bVar9;
}

Assistant:

bool ON_MeshTopology::TopEdgeIsHidden( int topei ) const
{
  // ugly - but faster than calling TopVertexIsHidden()
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topei >= 0 && topei < m_tope.Count()  )
  {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    int i;

    for ( i = 0; i < topv0.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv0.m_vi[i]] )
        break;
    }
    if ( i >= topv0.m_v_count )
      return true;

    for ( i = 0; i < topv1.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv1.m_vi[i]] )
        return false;
    }

    return true;
  }
  return false;
}